

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_unescape(Curl_easy *data,char *string,int length,int *olen)

{
  CURLcode CVar1;
  int iVar2;
  ulong uStack_48;
  CURLcode res;
  size_t outputlen;
  size_t inputlen;
  char *str;
  int *olen_local;
  char *pcStack_20;
  int length_local;
  char *string_local;
  Curl_easy *data_local;
  
  inputlen = 0;
  if (-1 < length) {
    outputlen = (size_t)length;
    str = (char *)olen;
    olen_local._4_4_ = length;
    pcStack_20 = string;
    string_local = (char *)data;
    CVar1 = Curl_urldecode(data,string,outputlen,(char **)&inputlen,&stack0xffffffffffffffb8,
                           REJECT_NADA);
    if (CVar1 != CURLE_OK) {
      return (char *)0x0;
    }
    if (str != (char *)0x0) {
      if (uStack_48 < 0x80000000) {
        iVar2 = curlx_uztosi(uStack_48);
        *(int *)str = iVar2;
      }
      else {
        (*Curl_cfree)((void *)inputlen);
        inputlen = 0;
      }
    }
  }
  return (char *)inputlen;
}

Assistant:

char *curl_easy_unescape(struct Curl_easy *data, const char *string,
                         int length, int *olen)
{
  char *str = NULL;
  if(length >= 0) {
    size_t inputlen = length;
    size_t outputlen;
    CURLcode res = Curl_urldecode(data, string, inputlen, &str, &outputlen,
                                  REJECT_NADA);
    if(res)
      return NULL;

    if(olen) {
      if(outputlen <= (size_t) INT_MAX)
        *olen = curlx_uztosi(outputlen);
      else
        /* too large to return in an int, fail! */
        Curl_safefree(str);
    }
  }
  return str;
}